

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *column)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  bVar1 = column->field_0x65;
  if ((bVar1 & 0xc) == 0) {
    __assert_fail("column->SortDirectionsAvailCount > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                  ,0xa53,
                  "ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *)");
  }
  if (column->SortOrder == -1) {
    if ((bVar1 & 0xc) == 0) {
LAB_0016fafb:
      __assert_fail("n < column->SortDirectionsAvailCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                    ,0xa40,
                    "ImGuiSortDirection TableGetColumnAvailSortDirection(ImGuiTableColumn *, int)");
    }
    uVar5 = column->SortDirectionsAvailList & 3;
  }
  else {
    uVar6 = bVar1 >> 2 & 3;
    bVar4 = 0;
    bVar7 = false;
    uVar3 = 0;
    do {
      if (uVar6 == uVar3) goto LAB_0016fafb;
      bVar2 = column->SortDirectionsAvailList;
      uVar5 = (uint)bVar2;
      if ((bVar2 >> (bVar4 & 0x1f) & 3) == (bVar1 & 3)) {
        uVar5 = bVar2 >> (char)((uVar3 + 1) % uVar6) * '\x02' & 3;
        break;
      }
      bVar7 = 1 < uVar3;
      uVar3 = uVar3 + 1;
      bVar4 = bVar4 + 2;
    } while (uVar3 != 3);
    if (bVar7) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                    ,0xa59,
                    "ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *)")
      ;
    }
  }
  return uVar5;
}

Assistant:

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn* column)
{
    IM_ASSERT(column->SortDirectionsAvailCount > 0);
    if (column->SortOrder == -1)
        return TableGetColumnAvailSortDirection(column, 0);
    for (int n = 0; n < 3; n++)
        if (column->SortDirection == TableGetColumnAvailSortDirection(column, n))
            return TableGetColumnAvailSortDirection(column, (n + 1) % column->SortDirectionsAvailCount);
    IM_ASSERT(0);
    return ImGuiSortDirection_None;
}